

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookahead.cpp
# Opt level: O0

void __thiscall Clasp::Lookahead::undoLevel(Lookahead *this,Solver *s)

{
  uint __fdin;
  bool bVar1;
  uint32 uVar2;
  size_type __fdout;
  size_type sVar3;
  Var n_00;
  LitNode *this_00;
  const_reference pLVar4;
  reference this_01;
  iterator pLVar5;
  reference puVar6;
  __off64_t *__offin;
  Solver *in_RSI;
  Lookahead *in_RDI;
  __off64_t *in_R8;
  size_t in_R9;
  NodeId n;
  iterator end;
  iterator it;
  iterator j;
  uint32 dist;
  Literal *b;
  LitVec *a;
  uint in_stack_ffffffffffffff18;
  uint32 in_stack_ffffffffffffff1c;
  Solver *in_stack_ffffffffffffff20;
  ScoreLook *pSVar7;
  Solver *in_stack_ffffffffffffff28;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *in_stack_ffffffffffffff30;
  Literal *in_stack_ffffffffffffff38;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *in_stack_ffffffffffffff40;
  Solver *in_stack_ffffffffffffff48;
  ScoreLook *in_stack_ffffffffffffff50;
  iterator local_38;
  iterator local_30;
  uint local_28;
  uint local_24;
  Literal *local_20;
  LitVec *local_18;
  Solver *local_10;
  
  local_10 = in_RSI;
  uVar2 = Solver::decisionLevel((Solver *)0x246344);
  __fdout = bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&in_RDI->saved_);
  if (uVar2 == __fdout) {
    PostPropagator::cancelPropagation((PostPropagator *)in_stack_ffffffffffffff20);
    local_18 = Solver::trail(local_10);
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[](local_18,0);
    Solver::decisionLevel((Solver *)0x2463de);
    Solver::levelStart(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[](local_18,0);
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::size(local_18);
    ScoreLook::scoreLits
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
               (Literal *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    uVar2 = Solver::decisionLevel((Solver *)0x246455);
    this_00 = head((Lookahead *)0x246469);
    bVar1 = Literal::flagged(&this_00->lit);
    if (uVar2 == bVar1) {
      pLVar4 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                         (local_18,0);
      Solver::decisionLevel((Solver *)0x2464b6);
      uVar2 = Solver::levelStart(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
      local_20 = pLVar4 + uVar2;
      bVar1 = Literal::flagged(local_20);
      if (bVar1) {
        pLVar4 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                           (local_18,0);
        sVar3 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::size(local_18);
        local_24 = (uint)((long)((long)pLVar4 + ((ulong)sVar3 * 4 - (long)local_20)) >> 2);
        local_28 = 0x800;
        std::min<unsigned_int>(&local_24,&local_28);
        bk_lib::pod_vector<Clasp::Literal,std::allocator<Clasp::Literal>>::
        assign<Clasp::Literal_const*>
                  (in_stack_ffffffffffffff30,(Literal *)in_stack_ffffffffffffff28,
                   (Literal *)in_stack_ffffffffffffff20);
      }
      else {
        pSVar7 = &in_RDI->score;
        n_00 = Literal::var(local_20);
        this_01 = bk_lib::pod_vector<Clasp::VarScore,_std::allocator<Clasp::VarScore>_>::operator[]
                            (&pSVar7->score,n_00);
        bVar1 = VarScore::testedBoth(this_01);
        if (bVar1) {
          local_30 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::begin
                               (&in_RDI->imps_);
          local_38 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::begin
                               (&in_RDI->imps_);
          pLVar5 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::end
                             (&in_RDI->imps_);
          for (; local_38 != pLVar5; local_38 = local_38 + 1) {
            bVar1 = Solver::isTrue(in_stack_ffffffffffffff28,
                                   (Literal)(uint32)((ulong)in_stack_ffffffffffffff30 >> 0x20));
            if (bVar1) {
              local_30->rep_ = local_38->rep_;
              local_30 = local_30 + 1;
            }
          }
          bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::end(&in_RDI->imps_);
          bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::erase
                    (in_stack_ffffffffffffff40,(iterator)pSVar7,local_30);
        }
      }
    }
  }
  else {
    pSVar7 = (ScoreLook *)&in_RDI->saved_;
    Solver::decisionLevel((Solver *)0x246709);
    bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff50,
               (size_type)((ulong)in_stack_ffffffffffffff48 >> 0x20),
               (uint *)in_stack_ffffffffffffff40);
    puVar6 = bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::back(&in_RDI->saved_);
    __fdin = *puVar6;
    bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::pop_back(&in_RDI->saved_);
    splice(in_RDI,__fdin,__offin,__fdout,in_R8,in_R9,in_stack_ffffffffffffff18);
    ScoreLook::clearDeps(pSVar7);
  }
  return;
}

Assistant:

void Lookahead::undoLevel(Solver& s) {
	if (s.decisionLevel() == saved_.size()) {
		cancelPropagation();
		const LitVec& a = s.trail();
		score.scoreLits(s, &a[0]+s.levelStart(s.decisionLevel()), &a[0]+a.size());
		if (s.decisionLevel() == static_cast<uint32>(head()->lit.flagged())) {
			const Literal* b = &a[0]+s.levelStart(s.decisionLevel());
			if (b->flagged()) {
				// remember current DL for b
				uint32 dist = static_cast<uint32>(((&a[0]+a.size()) - b));
				imps_.assign(b+1, b + std::min(dist, uint32(2048)));
			}
			else if (score.score[b->var()].testedBoth()) {
				// all true lits in imps_ follow from both *b and ~*b
				// and are therefore implied
				LitVec::iterator j = imps_.begin();
				for (LitVec::iterator it = imps_.begin(), end = imps_.end(); it != end; ++it) {
					if (s.isTrue(*it)) { *j++ = *it; }
				}
				imps_.erase(j, imps_.end());
			}
		}
	}
	else {
		assert(saved_.size() >= s.decisionLevel()+1);
		saved_.resize(s.decisionLevel()+1);
		NodeId n = saved_.back();
		saved_.pop_back();
		splice(n);
		assert(node(last_)->next == head_id);
		score.clearDeps();
	}
}